

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_contour.cpp
# Opt level: O3

void __thiscall agg::vcgen_contour::add_vertex(vcgen_contour *this,double x,double y,uint cmd)

{
  uint uVar1;
  vertex_dist local_18;
  
  this->m_status = initial;
  if (cmd == 1) {
    uVar1 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
    if (uVar1 != 0) {
      (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size = uVar1 - 1;
    }
  }
  else if (0xd < cmd - 1) {
    if ((~cmd & 0xf) != 0) {
      return;
    }
    this->m_closed = cmd & 0x40;
    if (this->m_orientation != 0) {
      return;
    }
    this->m_orientation = cmd & 0x30;
    return;
  }
  local_18.dist = 0.0;
  local_18.x = x;
  local_18.y = y;
  vertex_sequence<agg::vertex_dist,_6U>::add(&this->m_src_vertices,&local_18);
  return;
}

Assistant:

void vcgen_contour::add_vertex(double x, double y, unsigned cmd)
    {
        m_status = initial;
        if(is_move_to(cmd))
        {
            m_src_vertices.modify_last(vertex_dist(x, y));
        }
        else
        {
            if(is_vertex(cmd))
            {
                m_src_vertices.add(vertex_dist(x, y));
            }
            else
            {
                if(is_end_poly(cmd))
                {
                    m_closed = get_close_flag(cmd);
                    if(m_orientation == path_flags_none) 
                    {
                        m_orientation = get_orientation(cmd);
                    }
                }
            }
        }
    }